

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

void jpeg_make_c_derived_tbl(j_compress_ptr cinfo,boolean isDC,int tblno,c_derived_tbl **pdtbl)

{
  byte bVar1;
  jpeg_error_mgr *pjVar2;
  JHUFF_TBL *pJVar3;
  long lVar4;
  c_derived_tbl *pcVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  char huffsize [257];
  uint huffcode [257];
  char local_548 [272];
  uint local_438 [258];
  
  if (3 < (uint)tblno) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x32;
    (pjVar2->msg_parm).i[0] = tblno;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pJVar3 = cinfo->dc_huff_tbl_ptrs[(ulong)(isDC == 0) * 4 + (long)tblno];
  if (pJVar3 == (JHUFF_TBL *)0x0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x32;
    (pjVar2->msg_parm).i[0] = tblno;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (*pdtbl == (c_derived_tbl *)0x0) {
    pcVar5 = (c_derived_tbl *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x500);
    *pdtbl = pcVar5;
  }
  pcVar5 = *pdtbl;
  uVar7 = 0;
  lVar9 = 1;
  do {
    bVar1 = pJVar3->bits[lVar9];
    if (0x100 < (int)(uVar7 + bVar1)) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 8;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    if (bVar1 != 0) {
      memset(local_548 + (int)uVar7,(int)lVar9,(ulong)bVar1);
      uVar7 = uVar7 + bVar1;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x11);
  local_548[(int)uVar7] = '\0';
  iVar8 = (int)local_548[0];
  if (local_548[0] != '\0') {
    uVar10 = 0;
    iVar11 = 0;
    do {
      lVar9 = (long)iVar11;
      if (iVar8 == local_548[lVar9]) {
        lVar6 = 0;
        do {
          local_438[lVar9 + lVar6] = (int)uVar10 + (int)lVar6;
          lVar4 = lVar6 + lVar9;
          lVar6 = lVar6 + 1;
        } while (iVar8 == local_548[lVar4 + 1]);
        iVar11 = iVar11 + (int)lVar6;
        uVar10 = (ulong)(uint)((int)uVar10 + (int)lVar6);
      }
      if (1L << ((byte)iVar8 & 0x3f) <= (long)uVar10) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 8;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
      }
      uVar10 = (ulong)(uint)((int)uVar10 * 2);
      iVar8 = iVar8 + 1;
    } while (local_548[iVar11] != '\0');
  }
  memset(pcVar5,0,0x500);
  if (0 < (int)uVar7) {
    uVar10 = 0;
    do {
      bVar1 = pJVar3->huffval[uVar10];
      if (((isDC != 0) && (0xf < bVar1)) || (pcVar5->ehufsi[bVar1] != '\0')) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 8;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
      }
      pcVar5->ehufco[bVar1] = local_438[uVar10];
      pcVar5->ehufsi[bVar1] = local_548[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_make_c_derived_tbl(j_compress_ptr cinfo, boolean isDC, int tblno,
                        c_derived_tbl **pdtbl)
{
  JHUFF_TBL *htbl;
  c_derived_tbl *dtbl;
  int p, i, l, lastp, si, maxsymbol;
  char huffsize[257];
  unsigned int huffcode[257];
  unsigned int code;

  /* Note that huffsize[] and huffcode[] are filled in code-length order,
   * paralleling the order of the symbols themselves in htbl->huffval[].
   */

  /* Find the input Huffman table */
  if (tblno < 0 || tblno >= NUM_HUFF_TBLS)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);
  htbl =
    isDC ? cinfo->dc_huff_tbl_ptrs[tblno] : cinfo->ac_huff_tbl_ptrs[tblno];
  if (htbl == NULL)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);

  /* Allocate a workspace if we haven't already done so. */
  if (*pdtbl == NULL)
    *pdtbl = (c_derived_tbl *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  sizeof(c_derived_tbl));
  dtbl = *pdtbl;

  /* Figure C.1: make table of Huffman code length for each symbol */

  p = 0;
  for (l = 1; l <= 16; l++) {
    i = (int)htbl->bits[l];
    if (i < 0 || p + i > 256)   /* protect against table overrun */
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    while (i--)
      huffsize[p++] = (char)l;
  }
  huffsize[p] = 0;
  lastp = p;

  /* Figure C.2: generate the codes themselves */
  /* We also validate that the counts represent a legal Huffman code tree. */

  code = 0;
  si = huffsize[0];
  p = 0;
  while (huffsize[p]) {
    while (((int)huffsize[p]) == si) {
      huffcode[p++] = code;
      code++;
    }
    /* code is now 1 more than the last code used for codelength si; but
     * it must still fit in si bits, since no code is allowed to be all ones.
     */
    if (((JLONG)code) >= (((JLONG)1) << si))
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    code <<= 1;
    si++;
  }

  /* Figure C.3: generate encoding tables */
  /* These are code and size indexed by symbol value */

  /* Set all codeless symbols to have code length 0;
   * this lets us detect duplicate VAL entries here, and later
   * allows emit_bits to detect any attempt to emit such symbols.
   */
  MEMZERO(dtbl->ehufco, sizeof(dtbl->ehufco));
  MEMZERO(dtbl->ehufsi, sizeof(dtbl->ehufsi));

  /* This is also a convenient place to check for out-of-range
   * and duplicated VAL entries.  We allow 0..255 for AC symbols
   * but only 0..15 for DC.  (We could constrain them further
   * based on data depth and mode, but this seems enough.)
   */
  maxsymbol = isDC ? 15 : 255;

  for (p = 0; p < lastp; p++) {
    i = htbl->huffval[p];
    if (i < 0 || i > maxsymbol || dtbl->ehufsi[i])
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    dtbl->ehufco[i] = huffcode[p];
    dtbl->ehufsi[i] = huffsize[p];
  }
}